

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigObj.c
# Opt level: O1

void Aig_ObjPatchFanin0(Aig_Man_t *p,Aig_Obj_t *pObj,Aig_Obj_t *pFaninNew)

{
  ulong uVar1;
  uint uVar2;
  ulong uVar3;
  ulong uVar4;
  uint uVar5;
  Aig_Obj_t *pObj_00;
  
  if (((ulong)pObj & 1) != 0) {
    __assert_fail("!Aig_IsComplement(pObj)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/aig/aigObj.c"
                  ,0x11d,"void Aig_ObjPatchFanin0(Aig_Man_t *, Aig_Obj_t *, Aig_Obj_t *)");
  }
  if ((*(uint *)&pObj->field_0x18 & 7) != 3) {
    __assert_fail("Aig_ObjIsCo(pObj)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/aig/aigObj.c"
                  ,0x11e,"void Aig_ObjPatchFanin0(Aig_Man_t *, Aig_Obj_t *, Aig_Obj_t *)");
  }
  pObj_00 = (Aig_Obj_t *)((ulong)pObj->pFanin0 & 0xfffffffffffffffe);
  if (p->pFanData != (int *)0x0) {
    Aig_ObjRemoveFanout(p,pObj_00,pObj);
  }
  uVar1 = *(ulong *)&pObj_00->field_0x18;
  if ((uVar1 & 0xffffffc0) == 0) {
    __assert_fail("pObj->nRefs > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/aig/aig.h"
                  ,0x12e,"void Aig_ObjDeref(Aig_Obj_t *)");
  }
  *(ulong *)&pObj_00->field_0x18 =
       uVar1 & 0xffffffff0000003f | (ulong)((int)uVar1 - 0x40U & 0xffffffc0);
  pObj->pFanin0 = pFaninNew;
  uVar1 = (ulong)pObj->pFanin1 & 0xfffffffffffffffe;
  if (uVar1 == 0) {
    uVar5 = *(uint *)(((ulong)pFaninNew & 0xfffffffffffffffe) + 0x1c);
  }
  else {
    uVar2 = *(uint *)(((ulong)pFaninNew & 0xfffffffffffffffe) + 0x1c) & 0xffffff;
    uVar5 = *(uint *)(uVar1 + 0x1c) & 0xffffff;
    if (uVar5 < uVar2) {
      uVar5 = uVar2;
    }
    uVar5 = ((*(uint *)&pObj->field_0x18 & 7) == 6) + uVar5 + 1;
  }
  uVar1 = *(ulong *)&pObj->field_0x18;
  uVar3 = (ulong)(uVar5 & 0xffffff) << 0x20;
  *(ulong *)&pObj->field_0x18 = uVar1 & 0xff000000ffffffff | uVar3;
  if (pFaninNew == (Aig_Obj_t *)0x0) {
    uVar4 = 8;
  }
  else {
    uVar4 = (ulong)(((int)pFaninNew * 8 ^ *(uint *)(((ulong)pFaninNew & 0xfffffffffffffffe) + 0x18))
                   & 8);
  }
  *(ulong *)&pObj->field_0x18 = uVar1 & 0xff000000fffffff7 | uVar3 | uVar4;
  if (p->pFanData != (int *)0x0) {
    Aig_ObjAddFanout(p,(Aig_Obj_t *)((ulong)pFaninNew & 0xfffffffffffffffe),pObj);
  }
  uVar3 = (ulong)pObj->pFanin0 & 0xfffffffffffffffe;
  uVar1 = *(ulong *)(uVar3 + 0x18);
  *(ulong *)(uVar3 + 0x18) = uVar1 & 0xffffffff0000003f | (ulong)((int)uVar1 + 0x40U & 0xffffffc0);
  uVar5 = (uint)*(ulong *)&pObj_00->field_0x18 & 7;
  if ((uVar5 != 2) && ((*(ulong *)&pObj_00->field_0x18 & 0xffffffc0) == 0 && uVar5 != 1)) {
    Aig_ObjDelete_rec(p,pObj_00,1);
    return;
  }
  return;
}

Assistant:

void Aig_ObjPatchFanin0( Aig_Man_t * p, Aig_Obj_t * pObj, Aig_Obj_t * pFaninNew )
{
    Aig_Obj_t * pFaninOld;
    assert( !Aig_IsComplement(pObj) );
    assert( Aig_ObjIsCo(pObj) );
    pFaninOld = Aig_ObjFanin0(pObj);
    // decrement ref and remove fanout
    if ( p->pFanData )
        Aig_ObjRemoveFanout( p, pFaninOld, pObj );
    Aig_ObjDeref( pFaninOld );
    // update the fanin
    pObj->pFanin0 = pFaninNew;
    pObj->Level = Aig_ObjLevelNew( pObj );
    pObj->fPhase = Aig_ObjPhaseReal(pObj->pFanin0);
    // increment ref and add fanout
    if ( p->pFanData )
        Aig_ObjAddFanout( p, Aig_ObjFanin0(pObj), pObj );
    Aig_ObjRef( Aig_ObjFanin0(pObj) );
    // get rid of old fanin
    if ( !Aig_ObjIsCi(pFaninOld) && !Aig_ObjIsConst1(pFaninOld) && Aig_ObjRefs(pFaninOld) == 0 )
        Aig_ObjDelete_rec( p, pFaninOld, 1 );
}